

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O0

UBool __thiscall icu_63::RegexMatcher::matches(RegexMatcher *this,int64_t start,UErrorCode *status)

{
  UBool UVar1;
  int64_t iVar2;
  int64_t nativeStart;
  UErrorCode *status_local;
  int64_t start_local;
  RegexMatcher *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    UVar1 = ::U_FAILURE(this->fDeferredStatus);
    if (UVar1 == '\0') {
      reset(this);
      if (start < 0) {
        *status = U_INDEX_OUTOFBOUNDS_ERROR;
        this_local._7_1_ = '\0';
      }
      else {
        if ((this->fInputUniStrMaybeMutable != '\0') &&
           (UVar1 = compat_SyncMutableUTextContents(this->fInputText), UVar1 != '\0')) {
          iVar2 = utext_nativeLength_63(this->fInputText);
          this->fInputLength = iVar2;
          reset(this);
        }
        if ((start < this->fActiveStart) || (this->fActiveLimit < start)) {
          *status = U_INDEX_OUTOFBOUNDS_ERROR;
          this_local._7_1_ = '\0';
        }
        else {
          if (((this->fInputText->chunkNativeStart == 0) &&
              (this->fInputLength == this->fInputText->chunkNativeLimit)) &&
             (this->fInputLength == (long)this->fInputText->nativeIndexingLimit)) {
            MatchChunkAt(this,(int32_t)start,'\x01',status);
          }
          else {
            MatchAt(this,start,'\x01',status);
          }
          this_local._7_1_ = this->fMatch;
        }
      }
    }
    else {
      *status = this->fDeferredStatus;
      this_local._7_1_ = '\0';
    }
  }
  else {
    this_local._7_1_ = '\0';
  }
  return this_local._7_1_;
}

Assistant:

UBool RegexMatcher::matches(int64_t start, UErrorCode &status) {
    if (U_FAILURE(status)) {
        return FALSE;
    }
    if (U_FAILURE(fDeferredStatus)) {
        status = fDeferredStatus;
        return FALSE;
    }
    reset();

    if (start < 0) {
        status = U_INDEX_OUTOFBOUNDS_ERROR;
        return FALSE;
    }

    if (fInputUniStrMaybeMutable) {
        if (compat_SyncMutableUTextContents(fInputText)) {
        fInputLength = utext_nativeLength(fInputText);
        reset();
        }
    }

    int64_t nativeStart;
    nativeStart = start;
    if (nativeStart < fActiveStart || nativeStart > fActiveLimit) {
        status = U_INDEX_OUTOFBOUNDS_ERROR;
        return FALSE;
    }

    if (UTEXT_FULL_TEXT_IN_CHUNK(fInputText, fInputLength)) {
        MatchChunkAt((int32_t)nativeStart, TRUE, status);
    } else {
        MatchAt(nativeStart, TRUE, status);
    }
    return fMatch;
}